

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::TestEventListenerBase>::testRunEnded
          (StreamingReporterBase<Catch::TestEventListenerBase> *this,TestRunStats *param_1)

{
  TestRunStats *param_1_local;
  StreamingReporterBase<Catch::TestEventListenerBase> *this_local;
  
  LazyStat<Catch::TestCaseInfo>::reset(&this->currentTestCaseInfo);
  LazyStat<Catch::GroupInfo>::reset(&this->currentGroupInfo);
  LazyStat<Catch::TestRunInfo>::reset(&this->currentTestRunInfo);
  return;
}

Assistant:

void testRunEnded(TestRunStats const& /* _testRunStats */) override {
            currentTestCaseInfo.reset();
            currentGroupInfo.reset();
            currentTestRunInfo.reset();
        }